

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O2

void __thiscall
StunMsg_RFC5769SampleIPv6Response_Test::TestBody(StunMsg_RFC5769SampleIPv6Response_Test *this)

{
  sockaddr_in6 *psVar1;
  uint16_t uVar2;
  int iVar3;
  stun_attr_varsize *attr;
  void *vec_a;
  stun_attr_xor_sockaddr *attr_00;
  stun_attr_msgint *msgint;
  stun_attr_hdr *psVar4;
  long lVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  char *pcVar8;
  char *in_R9;
  AssertHelper local_188;
  AssertHelper local_180;
  AssertionResult gtest_ar_;
  sockaddr_in6 test_addr;
  char software_name [12];
  uint8_t tsx_id [12];
  char password [23];
  uint8_t expected_result [92];
  sockaddr_in6 ipv6;
  uint8_t buffer [92];
  
  builtin_strncpy(software_name,"test vector",0xc);
  builtin_strncpy(password,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  puVar6 = "\x01\x01";
  puVar7 = expected_result;
  for (lVar5 = 0x5c; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + 1;
    puVar7 = puVar7 + 1;
  }
  tsx_id[0] = 0xb7;
  tsx_id[1] = 0xe7;
  tsx_id[2] = 0xa7;
  tsx_id[3] = '\x01';
  tsx_id[4] = 0xbc;
  tsx_id[5] = '4';
  tsx_id[6] = 0xd6;
  tsx_id[7] = 0x86;
  tsx_id[8] = 0xfa;
  tsx_id[9] = 0x87;
  tsx_id[10] = 0xdf;
  tsx_id[0xb] = 0xae;
  ipv6.sin6_family = 10;
  ipv6.sin6_port = 0x5580;
  inet_pton(10,"2001:db8:1234:5678:11:2233:4455:6677",&ipv6.sin6_addr);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  local_188.data_ = (AssertHelperData *)0x5c;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&test_addr,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_188);
  if ((char)test_addr.sin6_family == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((undefined8 *)
        CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                 test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                  test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x167,pcVar8);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&test_addr.sin6_addr);
    gtest_ar_._0_4_ = 1;
    iVar3 = stun_msg_verify((stun_msg_hdr *)expected_result,0x5c);
    local_188.data_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&test_addr,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&gtest_ar_,(int *)&local_188);
    if ((char)test_addr.sin6_family == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((undefined8 *)
          CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                   test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                    test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x169,pcVar8);
      testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&test_addr.sin6_addr);
      stun_msg_hdr_init((stun_msg_hdr *)buffer,0x101,tsx_id);
      stun_attr_varsize_add((stun_msg_hdr *)buffer,0x8022,software_name,0xb,' ');
      stun_attr_xor_sockaddr_add((stun_msg_hdr *)buffer,0x20,(sockaddr *)&ipv6);
      stun_attr_msgint_add((stun_msg_hdr *)buffer,password,0x16);
      stun_attr_fingerprint_add((stun_msg_hdr *)buffer);
      anon_unknown.dwarf_6ced::IsEqual
                ((anon_unknown_dwarf_6ced *)&gtest_ar_,expected_result,(stun_msg_hdr *)buffer,0x5c);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_188);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&test_addr,(internal *)&gtest_ar_,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x174,(char *)test_addr._0_8_);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        std::__cxx11::string::~string((string *)&test_addr);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_188);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      gtest_ar_._0_4_ = 0x101;
      uVar2 = stun_msg_type((stun_msg_hdr *)expected_result);
      local_188.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&test_addr,"STUN_BINDING_RESPONSE","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&gtest_ar_,(unsigned_short *)&local_188);
      if ((char)test_addr.sin6_family == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((undefined8 *)
            CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                     test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                      test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x178,pcVar8);
        testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&test_addr.sin6_addr);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_188.data_ = (AssertHelperData *)stun_msg_len((stun_msg_hdr *)expected_result);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&test_addr,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_188);
      if ((char)test_addr.sin6_family == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((undefined8 *)
            CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                     test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                      test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x179,pcVar8);
        testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&test_addr.sin6_addr);
      attr = (stun_attr_varsize *)
             stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)0x0);
      gtest_ar_._0_4_ = 0x8022;
      uVar2 = stun_attr_type((stun_attr_hdr *)attr);
      local_188.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                ((internal *)&test_addr,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_188);
      if ((char)test_addr.sin6_family == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((undefined8 *)
            CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                     test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                      test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x17c,pcVar8);
        testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&test_addr.sin6_addr);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_188.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)attr);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&test_addr,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_188);
      if ((char)test_addr.sin6_family != '\0') {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&test_addr.sin6_addr);
        vec_a = stun_attr_varsize_read(attr);
        anon_unknown.dwarf_6ced::IsEqual
                  ((anon_unknown_dwarf_6ced *)&gtest_ar_,vec_a,software_name,0xb);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&test_addr,(internal *)&gtest_ar_,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x17f,(char *)test_addr._0_8_);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          std::__cxx11::string::~string((string *)&test_addr);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        attr_00 = (stun_attr_xor_sockaddr *)
                  stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr);
        gtest_ar_._0_4_ = 0x20;
        uVar2 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_188.data_._0_2_ = uVar2;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&test_addr,"STUN_ATTR_XOR_MAPPED_ADDRESS","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_188);
        if ((char)test_addr.sin6_family == '\0') {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((undefined8 *)
              CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                       test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                        test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_188,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x182,pcVar8);
          testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_188);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&test_addr.sin6_addr);
        test_addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
        test_addr._20_8_ = 0;
        test_addr.sin6_family = 0;
        test_addr.sin6_port = 0;
        test_addr.sin6_flowinfo = 0;
        test_addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
        test_addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
        local_188.data_ = local_188.data_ & 0xffffffff00000000;
        local_180.data_._0_4_ =
             stun_attr_xor_sockaddr_read
                       (attr_00,(stun_msg_hdr *)expected_result,(sockaddr *)&test_addr);
        testing::internal::CmpHelperEQ<stun_status_type,int>
                  ((internal *)&gtest_ar_,"STUN_OK",
                   "stun_attr_xor_sockaddr_read( (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr)"
                   ,(stun_status_type *)&local_188,(int *)&local_180);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x186,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_188.data_._0_4_ = 10;
        testing::internal::CmpHelperEQ<int,unsigned_short>
                  ((internal *)&gtest_ar_,"10","test_addr.sin6_family",(int *)&local_188,
                   &test_addr.sin6_family);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x187,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_188.data_._0_2_ = 0x5580;
        testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                  ((internal *)&gtest_ar_,"__bswap_16 (32853)","test_addr.sin6_port",
                   (unsigned_short *)&local_188,&test_addr.sin6_port);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x188,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_188.data_ = local_188.data_ & 0xffffffff00000000;
        local_180.data_._0_4_ = memcmp(&test_addr.sin6_addr,&ipv6.sin6_addr,0x10);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"0",
                   "memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr, sizeof(ipv6.sin6_addr))",
                   (int *)&local_188,(int *)&local_180);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x18a,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        msgint = (stun_attr_msgint *)
                 stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr_00);
        local_188.data_._0_4_ = 8;
        uVar2 = stun_attr_type((stun_attr_hdr *)msgint);
        local_180.data_._0_4_ = CONCAT22(local_180.data_._2_2_,uVar2);
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar_,"STUN_ATTR_MESSAGE_INTEGRITY","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_188,(unsigned_short *)&local_180);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x18d,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_188.data_._0_4_ = 1;
        local_180.data_._0_4_ =
             stun_attr_msgint_check(msgint,(stun_msg_hdr *)expected_result,(uint8_t *)password,0x16)
        ;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"1",
                   "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                   ,(int *)&local_188,(int *)&local_180);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,399,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        psVar4 = stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)msgint);
        local_188.data_._0_4_ = 0x8028;
        uVar2 = stun_attr_type(psVar4);
        local_180.data_._0_4_ = CONCAT22(local_180.data_._2_2_,uVar2);
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar_,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_188,(unsigned_short *)&local_180);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x192,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        psVar4 = stun_msg_next_attr((stun_msg_hdr *)expected_result,psVar4);
        testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                  ((EqHelper<true> *)&gtest_ar_,"__null","attr_hdr",(Secret *)0x0,psVar4);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_188);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x195,pcVar8);
          testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_188);
        }
        psVar1 = (sockaddr_in6 *)&gtest_ar_;
        goto LAB_00127bba;
      }
      testing::Message::Message((Message *)&gtest_ar_);
      if ((undefined8 *)
          CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                   test_addr.sin6_addr.__in6_u.__u6_addr32[0]) == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)CONCAT44(test_addr.sin6_addr.__in6_u.__u6_addr32[1],
                                    test_addr.sin6_addr.__in6_u.__u6_addr32[0]);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x17d,pcVar8);
      testing::internal::AssertHelper::operator=(&local_188,(Message *)&gtest_ar_);
    }
  }
  psVar1 = &test_addr;
  testing::internal::AssertHelper::~AssertHelper(&local_188);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
LAB_00127bba:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&psVar1->sin6_addr);
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleIPv6Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x48, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x14, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x02,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0x01,0x13,0xa9,0xfa, // }
    0xa5,0xd3,0xf1,0x79, // }  Xor'd mapped IPv6 address
    0xbc,0x25,0xf4,0xb5, // }
    0xbe,0xd2,0xb9,0xd9, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xa3,0x82,0x95,0x4e, // }
    0x4b,0xe6,0x7b,0xf1, // }
    0x17,0x84,0xc9,0x7c, // }  HMAC-SHA1 fingerprint
    0x82,0x92,0xc2,0x75, // }
    0xbf,0xe3,0xed,0x41, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc8,0xfb,0x0b,0x4c, //    CRC32 fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name)-1)
    + STUN_ATTR_SOCKADDR_SIZE(STUN_IPV6)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_UINT32_SIZE];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in6 ipv6;
  ipv6.sin6_family = AF_INET6;
  ipv6.sin6_port = htons(32853);
  inet_pton(AF_INET6, "2001:db8:1234:5678:11:2233:4455:6677", &ipv6.sin6_addr);

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));
  
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_RESPONSE, tsx_id);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
      sizeof(software_name)-1, ' ');
  stun_attr_xor_sockaddr_add(msg_hdr, STUN_ATTR_XOR_MAPPED_ADDRESS,
      (sockaddr *)&ipv6);
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_XOR_MAPPED_ADDRESS, stun_attr_type(attr_hdr));
  sockaddr_in6 test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_EQ(STUN_OK, stun_attr_xor_sockaddr_read(
      (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET6, test_addr.sin6_family);
  EXPECT_EQ(htons(32853), test_addr.sin6_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr,
      sizeof(ipv6.sin6_addr)));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}